

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_gencmn.cpp
# Opt level: O3

char * allocString(uint32_t length)

{
  char *extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong uVar1;
  uint uVar2;
  IcuToolErrorCode *this;
  
  uVar1 = (ulong)stringTop;
  uVar2 = length + stringTop;
  this = (IcuToolErrorCode *)(ulong)uVar2;
  if (uVar2 < 0x30d41) {
    stringTop = uVar2;
    return stringStore + uVar1;
  }
  allocString();
  (this->super_ErrorCode)._vptr_ErrorCode = (_func_int **)&PTR__IcuToolErrorCode_003a1fb0;
  if ((this->super_ErrorCode).errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::ErrorCode::~ErrorCode(&this->super_ErrorCode);
    return extraout_RAX;
  }
  icu_63::IcuToolErrorCode::handleFailure(this);
  __clang_call_terminate(extraout_RAX_00);
}

Assistant:

static char *
allocString(uint32_t length) {
    uint32_t top=stringTop+length;
    char *p;

    if(top>STRING_STORE_SIZE) {
        fprintf(stderr, "gencmn: out of memory\n");
        exit(U_MEMORY_ALLOCATION_ERROR);
    }
    p=stringStore+stringTop;
    stringTop=top;
    return p;
}